

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_wrapper.cc
# Opt level: O0

fdb_status fdb_set_kv(fdb_kvs_handle *handle,void *key,size_t keylen,void *value,size_t valuelen)

{
  ulong in_RDX;
  long in_RSI;
  fdb_kvs_handle *in_RDI;
  size_t in_R8;
  fdb_status fs;
  fdb_doc *doc;
  void *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  fdb_doc *in_stack_ffffffffffffffc8;
  fdb_status local_4;
  
  if ((((in_RSI == 0) || (in_RDX == 0)) || (0xff80 < in_RDX)) ||
     (((in_RDI->kvs_config).custom_cmp != (fdb_custom_cmp_variable)0x0 &&
      ((in_RDI->config).blocksize - 0x100 < in_RDX)))) {
    local_4 = FDB_RESULT_INVALID_ARGS;
  }
  else {
    local_4 = fdb_doc_create((fdb_doc **)in_stack_ffffffffffffffc8,
                             (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                             in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_R8,
                             (void *)0x1062b5,in_RDX);
    if (local_4 == FDB_RESULT_SUCCESS) {
      local_4 = fdb_set(in_RDI,in_stack_ffffffffffffffc8);
      if (local_4 == FDB_RESULT_SUCCESS) {
        fdb_doc_free((fdb_doc *)0x106361);
      }
      else if (in_stack_ffffffffffffffc8 != (fdb_doc *)0x0) {
        fdb_doc_free((fdb_doc *)0x10634d);
      }
    }
    else {
      if (in_stack_ffffffffffffffc8 != (fdb_doc *)0x0) {
        fdb_doc_free((fdb_doc *)0x1062d2);
      }
      fdb_log_impl(&in_RDI->log_callback,2,(fdb_status)(ulong)(uint)local_4,
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/api_wrapper.cc"
                   ,"fdb_set_kv",0x6b,
                   "Warning: Failed to allocate fdb_doc instance for key \'%s\' in fdb_set_kv API.",
                   in_RSI);
    }
  }
  return local_4;
}

Assistant:

LIBFDB_API
fdb_status fdb_set_kv(fdb_kvs_handle *handle,
                      const void *key, size_t keylen,
                      const void *value, size_t valuelen)
{
    fdb_doc *doc;
    fdb_status fs;

    if (key == NULL || keylen == 0 || keylen > FDB_MAX_KEYLEN ||
        (handle->kvs_config.custom_cmp &&
            keylen > handle->config.blocksize - HBTRIE_HEADROOM)) {
        return FDB_RESULT_INVALID_ARGS;
    }

    fs = fdb_doc_create(&doc, key, keylen, NULL, 0, value, valuelen);
    if (fs != FDB_RESULT_SUCCESS) { // LCOV_EXCL_START
        if (doc) {
            fdb_doc_free(doc);
        }
        fdb_log(&handle->log_callback, FDB_LOG_ERROR, fs,
                "Warning: Failed to allocate fdb_doc instance for key '%s' in "
                "fdb_set_kv API.", (const char *)key);
        return fs;
    } // LCOV_EXCL_STOP

    fs = fdb_set(handle, doc);
    if (fs != FDB_RESULT_SUCCESS) {
        if (doc) {
            fdb_doc_free(doc);
        }
        return fs;
    }
    fdb_doc_free(doc);

    return fs;
}